

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O1

void Super_WriteFileHeaderStr(Super_Man_t *pMan,Vec_Str_t *vStr)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  char pBuffer [1000];
  
  pBuffer[2] = '\0';
  pBuffer[0] = '#';
  pBuffer[1] = '\n';
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_00415467;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_00415467:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  pcVar5 = pMan->pName;
  pcVar6 = Extra_TimeStamp();
  sprintf(pBuffer,"# Supergate library derived for \"%s\" on %s.\n",pcVar5,pcVar6);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_0041552c;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_0041552c:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  pBuffer[2] = '\0';
  pBuffer[0] = '#';
  pBuffer[1] = '\n';
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_004155d6;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_004155d6:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  pcVar5 = "";
  if (pMan->fSkipInv == 0) {
    pcVar5 = "-s";
  }
  sprintf(pBuffer,"# Command line: \"super -I %d -L %d -N %d -T %d -D %.2f -A %.2f %s %s\".\n",
          (double)pMan->tDelayMax,(double)pMan->tAreaMax,(ulong)(uint)pMan->nVarsMax,
          (ulong)(uint)pMan->nLevels,(ulong)(uint)pMan->nGatesMax,(ulong)(uint)pMan->TimeLimit,
          pcVar5,pMan->pName);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_004156ca;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_004156ca:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  pBuffer[2] = '\0';
  pBuffer[0] = '#';
  pBuffer[1] = '\n';
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_00415774;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_00415774:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The number of inputs      = %10d.\n",(ulong)(uint)pMan->nVarsMax);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_0041582d;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_0041582d:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The number of levels      = %10d.\n",(ulong)(uint)pMan->nLevels);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_004158e6;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_004158e6:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The maximum delay         = %10.2f.\n",(double)pMan->tDelayMax);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_004159a4;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_004159a4:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The maximum area          = %10.2f.\n",(double)pMan->tAreaMax);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_00415a62;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_00415a62:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The maximum runtime (sec) = %10d.\n",(ulong)(uint)pMan->TimeLimit);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_00415b1e;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_00415b1e:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  pBuffer[2] = '\0';
  pBuffer[0] = '#';
  pBuffer[1] = '\n';
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_00415bc8;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_00415bc8:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The number of attempts    = %10d.\n",(ulong)(uint)pMan->nTried);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_00415c84;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_00415c84:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The number of supergates  = %10d.\n",(ulong)(uint)pMan->nGates);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_00415d40;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_00415d40:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# The number of functions   = %10d.\n",(ulong)(uint)pMan->nUnique);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_00415dfc;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_00415dfc:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  ldexp(1.0,pMan->nMints);
  sprintf(pBuffer,"# The total functions       = %.0f (2^%d).\n",(ulong)(uint)pMan->nMints);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_00415ec6;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_00415ec6:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  pBuffer[2] = '\0';
  pBuffer[0] = '#';
  pBuffer[1] = '\n';
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_00415f70;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_00415f70:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"# Generation time           = %10.2f sec.\n",(double)((float)pMan->Time / 1e+06))
  ;
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_0041603d;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_0041603d:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  pBuffer[2] = '\0';
  pBuffer[0] = '#';
  pBuffer[1] = '\n';
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_004160e7;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_004160e7:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"%s\n",pMan->pName);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_0041619f;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_0041619f:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"%d\n",(ulong)(uint)pMan->nVarsMax);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_00416258;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_00416258:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  sprintf(pBuffer,"%d\n",(ulong)(uint)pMan->nGates);
  sVar4 = strlen(pBuffer);
  if (0 < (int)(uint)sVar4) {
    uVar8 = 0;
    do {
      cVar1 = pBuffer[uVar8];
      uVar2 = vStr->nCap;
      if (vStr->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar7 = 0x10;
        }
        else {
          sVar7 = (ulong)uVar2 * 2;
          if ((int)sVar7 <= (int)uVar2) goto LAB_00416314;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar7);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar7);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar7;
      }
LAB_00416314:
      iVar3 = vStr->nSize;
      vStr->nSize = iVar3 + 1;
      vStr->pArray[iVar3] = cVar1;
      uVar8 = uVar8 + 1;
    } while (((uint)sVar4 & 0x7fffffff) != uVar8);
  }
  return;
}

Assistant:

void Super_WriteFileHeaderStr( Super_Man_t * pMan, Vec_Str_t * vStr )
{
    char pBuffer[1000];
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# Supergate library derived for \"%s\" on %s.\n", pMan->pName, Extra_TimeStamp() );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# Command line: \"super -I %d -L %d -N %d -T %d -D %.2f -A %.2f %s %s\".\n", 
        pMan->nVarsMax, pMan->nLevels, pMan->nGatesMax, pMan->TimeLimit, pMan->tDelayMax, pMan->tAreaMax, (pMan->fSkipInv? "" : "-s"), pMan->pName );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of inputs      = %10d.\n", pMan->nVarsMax );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of levels      = %10d.\n", pMan->nLevels );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The maximum delay         = %10.2f.\n", pMan->tDelayMax  );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The maximum area          = %10.2f.\n", pMan->tAreaMax );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The maximum runtime (sec) = %10d.\n", pMan->TimeLimit );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of attempts    = %10d.\n", pMan->nTried  );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of supergates  = %10d.\n", pMan->nGates  );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The number of functions   = %10d.\n", pMan->nUnique );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# The total functions       = %.0f (2^%d).\n", pow((double)2,pMan->nMints), pMan->nMints );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "# Generation time           = %10.2f sec.\n", (float)(pMan->Time)/(float)(CLOCKS_PER_SEC) );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "#\n" );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "%s\n", pMan->pName );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "%d\n", pMan->nVarsMax );
    Vec_StrPrintStr( vStr, pBuffer );
    sprintf( pBuffer, "%d\n", pMan->nGates );
    Vec_StrPrintStr( vStr, pBuffer );
}